

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall JSON::Parser::Parser(Parser *this,string *input)

{
  pointer pcVar1;
  
  this->pos = 0;
  (this->currentToken).value._M_dataplus._M_p = (pointer)&(this->currentToken).value.field_2;
  (this->currentToken).value._M_string_length = 0;
  (this->currentToken).value.field_2._M_local_buf[0] = '\0';
  (this->lastToken).value._M_dataplus._M_p = (pointer)&(this->lastToken).value.field_2;
  (this->lastToken).value._M_string_length = 0;
  (this->lastToken).value.field_2._M_local_buf[0] = '\0';
  (this->input)._M_dataplus._M_p = (pointer)&(this->input).field_2;
  pcVar1 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->input,pcVar1,pcVar1 + input->_M_string_length);
  (this->ast).type._M_dataplus._M_p = (pointer)&(this->ast).type.field_2;
  (this->ast).type._M_string_length = 0;
  (this->ast).type.field_2._M_local_buf[0] = '\0';
  (this->ast).rawValue._M_dataplus._M_p = (pointer)&(this->ast).rawValue.field_2;
  (this->ast).rawValue._M_string_length = 0;
  (this->ast).rawValue.field_2._M_local_buf[0] = '\0';
  (this->ast).children.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ast).children.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ast).children.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->length = (int)input->_M_string_length;
  return;
}

Assistant:

Parser::Parser(const string &input) : input(input) {
        length = input.length();
    }